

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_settings.cpp
# Opt level: O0

entry * libtorrent::dht::save_dht_settings(entry *__return_storage_ptr__,dht_settings *settings)

{
  bool bVar1;
  int iVar2;
  dictionary_type *pdVar3;
  mapped_type *pmVar4;
  allocator<char> local_301;
  key_type local_300;
  allocator<char> local_2d9;
  key_type local_2d8;
  allocator<char> local_2b1;
  key_type local_2b0;
  allocator<char> local_289;
  key_type local_288;
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  key_type local_238;
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  key_type local_1e8;
  allocator<char> local_1c1;
  key_type local_1c0;
  allocator<char> local_199;
  key_type local_198;
  allocator<char> local_171;
  key_type local_170;
  allocator<char> local_149;
  key_type local_148;
  allocator<char> local_121;
  key_type local_120;
  allocator<char> local_f9;
  key_type local_f8;
  allocator<char> local_d1;
  key_type local_d0;
  allocator<char> local_a9;
  key_type local_a8;
  allocator<char> local_81;
  key_type local_80;
  allocator<char> local_59;
  key_type local_58;
  dictionary_type *local_28;
  dictionary_type *dht_sett;
  dht_settings *local_18;
  dht_settings *settings_local;
  entry *e;
  
  dht_sett._7_1_ = 0;
  local_18 = settings;
  settings_local = (dht_settings *)__return_storage_ptr__;
  entry::entry(__return_storage_ptr__);
  pdVar3 = entry::dict_abi_cxx11_(__return_storage_ptr__);
  iVar2 = local_18->max_peers_reply;
  local_28 = pdVar3;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"max_peers_reply",&local_59);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_58);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  pdVar3 = local_28;
  iVar2 = local_18->search_branching;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"search_branching",&local_81);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_80);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::allocator<char>::~allocator(&local_81);
  pdVar3 = local_28;
  iVar2 = local_18->max_fail_count;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"max_fail_count",&local_a9);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_a8);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::allocator<char>::~allocator(&local_a9);
  pdVar3 = local_28;
  iVar2 = local_18->max_torrents;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"max_torrents",&local_d1)
  ;
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_d0);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::allocator<char>::~allocator(&local_d1);
  pdVar3 = local_28;
  iVar2 = local_18->max_dht_items;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"max_dht_items",&local_f9);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_f8);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_f8);
  ::std::allocator<char>::~allocator(&local_f9);
  pdVar3 = local_28;
  iVar2 = local_18->max_peers;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"max_peers",&local_121);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_120);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_120);
  ::std::allocator<char>::~allocator(&local_121);
  pdVar3 = local_28;
  iVar2 = local_18->max_torrent_search_reply;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"max_torrent_search_reply",&local_149);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_148);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_148);
  ::std::allocator<char>::~allocator(&local_149);
  pdVar3 = local_28;
  bVar1 = local_18->restrict_routing_ips;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"restrict_routing_ips",&local_171);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_170);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_170);
  ::std::allocator<char>::~allocator(&local_171);
  pdVar3 = local_28;
  bVar1 = local_18->restrict_search_ips;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"restrict_search_ips",&local_199);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_198);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_198);
  ::std::allocator<char>::~allocator(&local_199);
  pdVar3 = local_28;
  bVar1 = local_18->extended_routing_table;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"extended_routing_table",&local_1c1);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_1c0);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::allocator<char>::~allocator(&local_1c1);
  pdVar3 = local_28;
  bVar1 = local_18->aggressive_lookups;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"aggressive_lookups",&local_1e9);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_1e8);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_1e8);
  ::std::allocator<char>::~allocator(&local_1e9);
  pdVar3 = local_28;
  bVar1 = local_18->privacy_lookups;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"privacy_lookups",&local_211);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_210);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_210);
  ::std::allocator<char>::~allocator(&local_211);
  pdVar3 = local_28;
  bVar1 = local_18->enforce_node_id;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"enforce_node_id",&local_239);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_238);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_238);
  ::std::allocator<char>::~allocator(&local_239);
  pdVar3 = local_28;
  bVar1 = local_18->ignore_dark_internet;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"ignore_dark_internet",&local_261);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_260);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_260);
  ::std::allocator<char>::~allocator(&local_261);
  pdVar3 = local_28;
  iVar2 = local_18->block_timeout;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"block_timeout",&local_289);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_288);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_288);
  ::std::allocator<char>::~allocator(&local_289);
  pdVar3 = local_28;
  iVar2 = local_18->block_ratelimit;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"block_ratelimit",&local_2b1);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_2b0);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_2b0);
  ::std::allocator<char>::~allocator(&local_2b1);
  pdVar3 = local_28;
  bVar1 = local_18->read_only;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"read_only",&local_2d9);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_2d8);
  entry::operator=(pmVar4,(ulong)(bVar1 & 1));
  ::std::__cxx11::string::~string((string *)&local_2d8);
  ::std::allocator<char>::~allocator(&local_2d9);
  pdVar3 = local_28;
  iVar2 = local_18->item_lifetime;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"item_lifetime",&local_301);
  pmVar4 = boost::container::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
           ::operator[](pdVar3,&local_300);
  entry::operator=(pmVar4,(long)iVar2);
  ::std::__cxx11::string::~string((string *)&local_300);
  ::std::allocator<char>::~allocator(&local_301);
  return __return_storage_ptr__;
}

Assistant:

entry save_dht_settings(dht_settings const& settings)
	{
		entry e;
		entry::dictionary_type& dht_sett = e.dict();

		dht_sett["max_peers_reply"] = settings.max_peers_reply;
		dht_sett["search_branching"] = settings.search_branching;
		dht_sett["max_fail_count"] = settings.max_fail_count;
		dht_sett["max_torrents"] = settings.max_torrents;
		dht_sett["max_dht_items"] = settings.max_dht_items;
		dht_sett["max_peers"] = settings.max_peers;
		dht_sett["max_torrent_search_reply"] = settings.max_torrent_search_reply;
		dht_sett["restrict_routing_ips"] = settings.restrict_routing_ips;
		dht_sett["restrict_search_ips"] = settings.restrict_search_ips;
		dht_sett["extended_routing_table"] = settings.extended_routing_table;
		dht_sett["aggressive_lookups"] = settings.aggressive_lookups;
		dht_sett["privacy_lookups"] = settings.privacy_lookups;
		dht_sett["enforce_node_id"] = settings.enforce_node_id;
		dht_sett["ignore_dark_internet"] = settings.ignore_dark_internet;
		dht_sett["block_timeout"] = settings.block_timeout;
		dht_sett["block_ratelimit"] = settings.block_ratelimit;
		dht_sett["read_only"] = settings.read_only;
		dht_sett["item_lifetime"] = settings.item_lifetime;

		return e;
	}